

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

int __thiscall
gl3cts::TransformFeedbackOverflowQueryBaseTest::init
          (TransformFeedbackOverflowQueryBaseTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  GLuint GVar2;
  NotSupportedError *this_00;
  TransformFeedbackOverflowQueryBaseTest *pTVar3;
  ContextInfo *pCVar4;
  allocator<char> local_31;
  string local_30;
  TransformFeedbackOverflowQueryBaseTest *local_10;
  TransformFeedbackOverflowQueryBaseTest *this_local;
  undefined7 extraout_var;
  
  local_10 = this;
  bVar1 = featureSupported(this);
  if (bVar1) {
    bVar1 = supportsTransformFeedback3(this);
    pTVar3 = (TransformFeedbackOverflowQueryBaseTest *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      pCVar4 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
      GVar2 = (*pCVar4->_vptr_ContextInfo[2])(pCVar4,0x8e71);
      this->m_max_vertex_streams = GVar2;
      pTVar3 = this;
    }
    return (int)pTVar3;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "Required transform_feedback_overflow_query extension is not supported",&local_31);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

virtual void init()
	{
		if (!featureSupported())
		{
			throw tcu::NotSupportedError("Required transform_feedback_overflow_query extension is not supported");
		}

		if (supportsTransformFeedback3())
		{
			m_max_vertex_streams = (GLuint)m_context.getContextInfo().getInt(GL_MAX_VERTEX_STREAMS);
		}
	}